

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTableBuilderVisitor.cpp
# Opt level: O0

void __thiscall
hdc::SymbolTableBuilderVisitor::visit(SymbolTableBuilderVisitor *this,Program *program)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_50;
  _Base_ptr local_48;
  _Self local_40;
  _Base_ptr local_38;
  _Self local_30;
  _Base_ptr local_28;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::SourceFile_*>_>
  local_20;
  iterator it;
  Program *program_local;
  SymbolTableBuilderVisitor *this_local;
  
  it._M_node = (_Base_ptr)program;
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::SourceFile_*>_>
  ::_Rb_tree_iterator(&local_20);
  local_28 = (_Base_ptr)Program::begin_abi_cxx11_(it._M_node);
  local_20._M_node = local_28;
  while( true ) {
    local_30._M_node = (_Base_ptr)Program::end_abi_cxx11_(it._M_node);
    bVar1 = std::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::SourceFile_*>_>
             ::operator->(&local_20);
    (**(ppVar2->second->super_ASTNode)._vptr_ASTNode)(ppVar2->second,this);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::SourceFile_*>_>
    ::operator++(&local_20);
  }
  this->pass = this->pass + 1;
  local_38 = (_Base_ptr)Program::begin_abi_cxx11_(it._M_node);
  local_20._M_node = local_38;
  while( true ) {
    local_40._M_node = (_Base_ptr)Program::end_abi_cxx11_(it._M_node);
    bVar1 = std::operator!=(&local_20,&local_40);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::SourceFile_*>_>
             ::operator->(&local_20);
    (**(ppVar2->second->super_ASTNode)._vptr_ASTNode)(ppVar2->second,this);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::SourceFile_*>_>
    ::operator++(&local_20);
  }
  this->pass = this->pass + 1;
  local_48 = (_Base_ptr)Program::begin_abi_cxx11_(it._M_node);
  local_20._M_node = local_48;
  while( true ) {
    local_50._M_node = (_Base_ptr)Program::end_abi_cxx11_(it._M_node);
    bVar1 = std::operator!=(&local_20,&local_50);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::SourceFile_*>_>
             ::operator->(&local_20);
    (**(ppVar2->second->super_ASTNode)._vptr_ASTNode)(ppVar2->second,this);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::SourceFile_*>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void SymbolTableBuilderVisitor::visit(Program *program) {
    std::map<std::string, SourceFile*>::iterator it;

    // First, we add all classes, structs, enums and other named types to
    // the symbol table of a source file.
    for (it = program->begin(); it != program->end(); ++it) {
        it->second->accept(this);
    }

    ++pass;

    // Now that named types are inserted on symbol tables, some form of type
    // checking can be done. But first we link types to their descriptors. The types
    // we are linking to its descriptors are: return types of methods and functions,
    // parameters' types, class variable types, parent class and stuff like that.
    // Note that we are linking only types to its descriptors. The insertion
    // on symbol table comes latter. In other words, we are linking everything now
    // and on later passes we may discard some of these associations. For example,
    // two methods with the same signature or two class variables with same name
    for (it = program->begin(); it != program->end(); ++it) {
        it->second->accept(this);
    }

    ++pass;

    // now we build the symbol table for the function and method bodies
    for (it = program->begin(); it != program->end(); ++it) {
        it->second->accept(this);
    }
}